

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vulkan.c
# Opt level: O0

VkResult glfwCreateWindowSurface
                   (VkInstance_conflict instance,GLFWwindow *handle,VkAllocationCallbacks *allocator
                   ,VkSurfaceKHR_conflict *surface)

{
  GLFWbool GVar1;
  _GLFWwindow *window;
  VkSurfaceKHR_conflict *surface_local;
  VkAllocationCallbacks *allocator_local;
  GLFWwindow *handle_local;
  VkInstance_conflict instance_local;
  
  if (instance == (VkInstance_conflict)0x0) {
    __assert_fail("instance != VK_NULL_HANDLE",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/glfw/src/vulkan.c"
                  ,0x131,
                  "VkResult glfwCreateWindowSurface(VkInstance, GLFWwindow *, const VkAllocationCallbacks *, VkSurfaceKHR *)"
                 );
  }
  if (handle != (GLFWwindow *)0x0) {
    if (surface != (VkSurfaceKHR_conflict *)0x0) {
      *surface = 0;
      if (_glfw.initialized == 0) {
        _glfwInputError(0x10001,(char *)0x0);
        instance_local._4_4_ = VK_ERROR_INITIALIZATION_FAILED;
      }
      else {
        GVar1 = _glfwInitVulkan(2);
        if (GVar1 == 0) {
          instance_local._4_4_ = VK_ERROR_INITIALIZATION_FAILED;
        }
        else if (_glfw.vk.extensions[0] == (char *)0x0) {
          _glfwInputError(0x10006,"Vulkan: Window surface creation extensions not found");
          instance_local._4_4_ = VK_ERROR_EXTENSION_NOT_PRESENT;
        }
        else if (*(int *)(handle + 0x200) == 0) {
          instance_local._4_4_ =
               _glfwPlatformCreateWindowSurface(instance,(_GLFWwindow *)handle,allocator,surface);
        }
        else {
          _glfwInputError(0x10004,
                          "Vulkan: Window surface creation requires the window to have the client API set to GLFW_NO_API"
                         );
          instance_local._4_4_ = VK_ERROR_NATIVE_WINDOW_IN_USE_KHR;
        }
      }
      return instance_local._4_4_;
    }
    __assert_fail("surface != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/glfw/src/vulkan.c"
                  ,0x133,
                  "VkResult glfwCreateWindowSurface(VkInstance, GLFWwindow *, const VkAllocationCallbacks *, VkSurfaceKHR *)"
                 );
  }
  __assert_fail("window != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/glfw/src/vulkan.c"
                ,0x132,
                "VkResult glfwCreateWindowSurface(VkInstance, GLFWwindow *, const VkAllocationCallbacks *, VkSurfaceKHR *)"
               );
}

Assistant:

GLFWAPI VkResult glfwCreateWindowSurface(VkInstance instance,
                                         GLFWwindow* handle,
                                         const VkAllocationCallbacks* allocator,
                                         VkSurfaceKHR* surface)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(instance != VK_NULL_HANDLE);
    assert(window != NULL);
    assert(surface != NULL);

    *surface = VK_NULL_HANDLE;

    _GLFW_REQUIRE_INIT_OR_RETURN(VK_ERROR_INITIALIZATION_FAILED);

    if (!_glfwInitVulkan(_GLFW_REQUIRE_LOADER))
        return VK_ERROR_INITIALIZATION_FAILED;

    if (!_glfw.vk.extensions[0])
    {
        _glfwInputError(GLFW_API_UNAVAILABLE,
                        "Vulkan: Window surface creation extensions not found");
        return VK_ERROR_EXTENSION_NOT_PRESENT;
    }

    if (window->context.client != GLFW_NO_API)
    {
        _glfwInputError(GLFW_INVALID_VALUE,
                        "Vulkan: Window surface creation requires the window to have the client API set to GLFW_NO_API");
        return VK_ERROR_NATIVE_WINDOW_IN_USE_KHR;
    }

    return _glfwPlatformCreateWindowSurface(instance, window, allocator, surface);
}